

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_misc.cpp
# Opt level: O0

void M_FindResponseFile(void)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  DArgs *pDVar7;
  size_t len;
  int local_84;
  int k;
  FString local_78;
  FString local_70 [3];
  DArgs *local_58;
  DArgs *newargs;
  long lStack_48;
  int index;
  long argsize;
  FILE *pFStack_38;
  int size;
  FILE *handle;
  char *pcStack_28;
  int argc;
  char *file;
  char **argv;
  uint local_10;
  int i;
  int added_stuff;
  int limit;
  
  i = 100;
  local_10 = 0;
  argv._4_4_ = 1;
  while (iVar4 = argv._4_4_, iVar2 = DArgs::NumArgs(Args), uVar1 = local_10, iVar4 < iVar2) {
    pcVar5 = DArgs::GetArg(Args,argv._4_4_);
    if (*pcVar5 == '@') {
      pcStack_28 = (char *)0x0;
      handle._4_4_ = 0;
      lStack_48 = 0;
      if ((int)local_10 < 100) {
        pcVar5 = DArgs::GetArg(Args,argv._4_4_);
        pFStack_38 = fopen(pcVar5 + 1,"rb");
        if (pFStack_38 == (FILE *)0x0) {
          pcVar5 = DArgs::GetArg(Args,argv._4_4_);
          Printf("No such response file (%s)!\n",pcVar5 + 1);
        }
        else {
          pcVar5 = DArgs::GetArg(Args,argv._4_4_);
          Printf("Found response file %s!\n",pcVar5 + 1);
          fseek(pFStack_38,0,2);
          lVar6 = ftell(pFStack_38);
          argsize._4_4_ = (int)lVar6;
          fseek(pFStack_38,0,0);
          pcStack_28 = (char *)operator_new__((long)(argsize._4_4_ + 1));
          fread(pcStack_28,(long)argsize._4_4_,1,pFStack_38);
          pcStack_28[argsize._4_4_] = '\0';
          fclose(pFStack_38);
          lStack_48 = ParseCommandLine(pcStack_28,(int *)((long)&handle + 4),(char **)0x0);
        }
      }
      else {
        pcVar5 = DArgs::GetArg(Args,argv._4_4_);
        Printf("Ignored response file %s.\n",pcVar5 + 1);
      }
      if (handle._4_4_ == 0) {
        DArgs::RemoveArg(Args,argv._4_4_);
      }
      else {
        file = (char *)M_Malloc_Dbg(lStack_48 + (long)handle._4_4_ * 8,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/m_misc.cpp"
                                    ,0xe3);
        *(char ***)file = (char **)((long)file + (long)handle._4_4_ * 8);
        len = 0;
        ParseCommandLine(pcStack_28,(int *)0x0,(char **)file);
        pDVar7 = (DArgs *)DObject::operator_new((DObject *)0x38,len);
        DArgs::DArgs(pDVar7);
        local_58 = pDVar7;
        for (newargs._4_4_ = 0; pDVar7 = local_58, newargs._4_4_ < argv._4_4_;
            newargs._4_4_ = newargs._4_4_ + 1) {
          pcVar5 = DArgs::GetArg(Args,newargs._4_4_);
          FString::FString(local_70,pcVar5);
          DArgs::AppendArg(pDVar7,local_70);
          FString::~FString(local_70);
        }
        for (newargs._4_4_ = 0; pDVar7 = local_58, iVar4 = argv._4_4_, newargs._4_4_ < handle._4_4_;
            newargs._4_4_ = newargs._4_4_ + 1) {
          FString::FString(&local_78,*(char **)(file + (long)newargs._4_4_ * 8));
          DArgs::AppendArg(pDVar7,&local_78);
          FString::~FString(&local_78);
        }
        while( true ) {
          newargs._4_4_ = iVar4 + 1;
          iVar4 = newargs._4_4_;
          iVar2 = DArgs::NumArgs(Args);
          pDVar7 = local_58;
          if (iVar2 <= iVar4) break;
          pcVar5 = DArgs::GetArg(Args,newargs._4_4_);
          FString::FString((FString *)&stack0xffffffffffffff80,pcVar5);
          DArgs::AppendArg(pDVar7,(FString *)&stack0xffffffffffffff80);
          FString::~FString((FString *)&stack0xffffffffffffff80);
          iVar4 = newargs._4_4_;
        }
        Args = local_58;
        local_10 = local_10 + 1;
        if (local_10 == 100) {
          Printf("Response file limit of %d hit.\n",100);
        }
      }
      if ((pcStack_28 != (char *)0x0) && (pcStack_28 != (char *)0x0)) {
        operator_delete__(pcStack_28);
      }
    }
    else {
      argv._4_4_ = argv._4_4_ + 1;
    }
  }
  if (0 < (int)local_10) {
    pcVar5 = "";
    if (1 < (int)local_10) {
      pcVar5 = "s";
    }
    uVar3 = DArgs::NumArgs(Args);
    Printf("Added %d response file%s, now have %d command-line args:\n",(ulong)uVar1,pcVar5,
           (ulong)uVar3);
    for (local_84 = 1; iVar4 = DArgs::NumArgs(Args), local_84 < iVar4; local_84 = local_84 + 1) {
      pcVar5 = DArgs::GetArg(Args,local_84);
      Printf("%s\n",pcVar5);
    }
  }
  return;
}

Assistant:

void M_FindResponseFile (void)
{
	const int limit = 100;	// avoid infinite recursion
	int added_stuff = 0;
	int i = 1;

	while (i < Args->NumArgs())
	{
		if (Args->GetArg(i)[0] != '@')
		{
			i++;
		}
		else
		{
			char	**argv;
			char	*file = NULL;
			int		argc = 0;
			FILE	*handle;
			int 	size;
			long	argsize = 0;
			int 	index;

			// Any more response files after the limit will be removed from the
			// command line.
			if (added_stuff < limit)
			{
				// READ THE RESPONSE FILE INTO MEMORY
				handle = fopen (Args->GetArg(i) + 1,"rb");
				if (!handle)
				{ // [RH] Make this a warning, not an error.
					Printf ("No such response file (%s)!\n", Args->GetArg(i) + 1);
				}
				else
				{
					Printf ("Found response file %s!\n", Args->GetArg(i) + 1);
					fseek (handle, 0, SEEK_END);
					size = ftell (handle);
					fseek (handle, 0, SEEK_SET);
					file = new char[size+1];
					fread (file, size, 1, handle);
					file[size] = 0;
					fclose (handle);

					argsize = ParseCommandLine (file, &argc, NULL);
				}
			}
			else
			{
				Printf ("Ignored response file %s.\n", Args->GetArg(i) + 1);
			}

			if (argc != 0)
			{
				argv = (char **)M_Malloc (argc*sizeof(char *) + argsize);
				argv[0] = (char *)argv + argc*sizeof(char *);
				ParseCommandLine (file, NULL, argv);

				// Create a new argument vector
				DArgs *newargs = new DArgs;

				// Copy parameters before response file.
				for (index = 0; index < i; ++index)
					newargs->AppendArg(Args->GetArg(index));

				// Copy parameters from response file.
				for (index = 0; index < argc; ++index)
					newargs->AppendArg(argv[index]);

				// Copy parameters after response file.
				for (index = i + 1; index < Args->NumArgs(); ++index)
					newargs->AppendArg(Args->GetArg(index));

				// Use the new argument vector as the global Args object.
				Args = newargs;
				if (++added_stuff == limit)
				{
					Printf("Response file limit of %d hit.\n", limit);
				}
			}
			else
			{
				// Remove the response file from the Args object
				Args->RemoveArg(i);
			}
			if (file != NULL)
			{
				delete[] file;
			}
		}
	}
	if (added_stuff > 0)
	{
		// DISPLAY ARGS
		Printf ("Added %d response file%s, now have %d command-line args:\n",
			added_stuff, added_stuff > 1 ? "s" : "", Args->NumArgs ());
		for (int k = 1; k < Args->NumArgs (); k++)
			Printf ("%s\n", Args->GetArg (k));
	}
}